

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_type_range
                 (lysc_ctx *ctx,lysp_restr *range_p,LY_DATA_TYPE basetype,ly_bool length_restr,
                 uint8_t frdigits,lysc_range *base_range,lysc_range **range)

{
  char cVar1;
  lysc_range_part *plVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  lysp_restr *plVar6;
  LY_ERR LVar7;
  ushort **ppuVar8;
  undefined8 *puVar9;
  long lVar10;
  long *plVar11;
  lysc_range *plVar12;
  uint uVar13;
  long prev;
  int64_t iVar14;
  ulong uVar15;
  char *pcVar16;
  lysc_range_part *part;
  ulong uVar17;
  ly_ctx *plVar18;
  char *pcVar19;
  char *pcVar20;
  ulong uVar21;
  char **value;
  long local_60;
  char *local_58;
  lysc_range *local_50;
  ulong local_48;
  ulong local_40;
  lysp_restr *local_38;
  
  local_50 = base_range;
  if (range == (lysc_range **)0x0) {
    __assert_fail("range",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0x360,
                  "LY_ERR lys_compile_type_range(struct lysc_ctx *, const struct lysp_restr *, LY_DATA_TYPE, ly_bool, uint8_t, struct lysc_range *, struct lysc_range **)"
                 );
  }
  if (range_p == (lysp_restr *)0x0) {
    __assert_fail("range_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0x361,
                  "LY_ERR lys_compile_type_range(struct lysc_ctx *, const struct lysp_restr *, LY_DATA_TYPE, ly_bool, uint8_t, struct lysc_range *, struct lysc_range **)"
                 );
  }
  pcVar19 = (range_p->arg).str;
  part = (lysc_range_part *)0x0;
  local_58 = pcVar19;
  local_38 = range_p;
  ppuVar8 = __ctype_b_loc();
  local_40 = (ulong)frdigits;
  local_48 = (ulong)length_restr;
  bVar5 = false;
  local_60 = 0;
LAB_0014473d:
  do {
    while( true ) {
      while( true ) {
        plVar6 = local_38;
        cVar1 = *pcVar19;
        if (((*ppuVar8)[cVar1] >> 0xd & 1) == 0) break;
        local_58 = pcVar19 + 1;
        pcVar19 = local_58;
      }
      if (cVar1 == '\0') {
        if (bVar5) {
          plVar18 = ctx->ctx;
          pcVar20 = "length";
          if (length_restr == '\0') {
            pcVar20 = "range";
          }
          pcVar19 = (local_38->arg).str;
          pcVar16 = "Invalid %s restriction - unexpected end of the expression after \"..\" (%s).";
          goto LAB_00144e45;
        }
        if ((part == (lysc_range_part *)0x0) || (local_60 == part[-1].field_1.max_64)) {
          plVar18 = ctx->ctx;
          pcVar20 = "length";
          if (length_restr == '\0') {
            pcVar20 = "range";
          }
          pcVar19 = (local_38->arg).str;
          pcVar16 = "Invalid %s restriction - unexpected end of the expression (%s).";
          goto LAB_00144e45;
        }
        if (local_50 == (lysc_range *)0x0) goto LAB_00144eae;
        uVar13 = basetype - LY_TYPE_BINARY;
        if ((0x12 < uVar13) || ((0x7813fU >> (uVar13 & 0x1f) & 1) == 0)) {
          LVar7 = LY_EINT;
          ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                 ,0x3da);
          goto LAB_00144e57;
        }
        uVar13 = 0x78100 >> ((byte)uVar13 & 0x1f);
        if (local_60 != -1) {
          plVar2 = local_50->parts;
          uVar17 = 0;
          uVar15 = 0;
          goto LAB_00144d47;
        }
        uVar15 = 0;
        goto LAB_00144ea5;
      }
      if (cVar1 != 'm') break;
      if ((pcVar19[1] != 'i') || (pcVar19[2] != 'n')) goto LAB_0014487d;
      if (part != (lysc_range_part *)0x0) {
        pcVar20 = "length";
        if (length_restr == '\0') {
          pcVar20 = "range";
        }
        pcVar16 = (local_38->arg).str;
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid %s restriction - unexpected data before min keyword (%.*s).",pcVar20,
                (ulong)(uint)((int)pcVar19 - (int)pcVar16),pcVar16);
        LVar7 = LY_EVALID;
        goto LAB_00144e57;
      }
      local_58 = pcVar19 + 3;
      puVar9 = (undefined8 *)malloc(0x18);
      if (puVar9 == (undefined8 *)0x0) {
LAB_00144be7:
        plVar18 = ctx->ctx;
        goto LAB_00144beb;
      }
      *puVar9 = 1;
      part = (lysc_range_part *)(puVar9 + 1);
      puVar9[1] = 0;
      puVar9[2] = 0;
      LVar7 = range_part_minmax(ctx,part,'\0',0,basetype,'\x01',(ly_bool)local_48,(uint8_t)local_40,
                                local_50,(char **)0x0);
      if (LVar7 != LY_SUCCESS) goto LAB_00144e57;
      puVar9[2] = puVar9[1];
      pcVar19 = local_58;
    }
    if (cVar1 != '.') {
      if (cVar1 != '|') {
LAB_0014487d:
        if ((((*ppuVar8)[cVar1] >> 0xb & 1) == 0) && ((cVar1 != '-' && (cVar1 != '+')))) {
          if (((cVar1 != 'm') || (pcVar19[1] != 'a')) || (pcVar19[2] != 'x')) {
            plVar18 = ctx->ctx;
            pcVar20 = "length";
            if (length_restr == '\0') {
              pcVar20 = "range";
            }
            pcVar16 = "Invalid %s restriction - unexpected data (%s).";
            goto LAB_00144e45;
          }
          pcVar20 = pcVar19 + 3;
          do {
            pcVar19 = pcVar20;
            pcVar20 = pcVar19 + 1;
          } while ((*(byte *)((long)*ppuVar8 + (long)*pcVar19 * 2 + 1) & 0x20) != 0);
          local_58 = pcVar19;
          if (*pcVar19 != '\0') {
            plVar18 = ctx->ctx;
            pcVar20 = "length";
            if (length_restr == '\0') {
              pcVar20 = "range";
            }
            pcVar16 = "Invalid %s restriction - unexpected data after max keyword (%s).";
            goto LAB_00144e45;
          }
          if (!bVar5) {
            if (part == (lysc_range_part *)0x0) {
              plVar11 = (long *)malloc(0x18);
              if (plVar11 == (long *)0x0) goto LAB_00144be7;
              *plVar11 = 1;
              lVar10 = 1;
            }
            else {
              lVar10 = part[-1].field_1.max_64 + 1;
              part[-1].field_1.max_64 = lVar10;
              plVar11 = (long *)realloc(&part[-1].field_1,lVar10 * 0x10 | 8);
              if (plVar11 == (long *)0x0) goto LAB_00144c6c;
              lVar10 = *plVar11;
            }
            part = (lysc_range_part *)(plVar11 + 1);
            plVar11[lVar10 * 2 + -1] = 0;
            (plVar11 + lVar10 * 2 + -1)[1] = 0;
            if (local_60 == 0) {
              iVar14 = 0;
            }
            else {
              iVar14 = part[*plVar11 + -2].field_1.max_64;
            }
            LVar7 = range_part_minmax(ctx,(lysc_range_part *)(plVar11 + lVar10 * 2 + -1),'\x01',
                                      iVar14,basetype,local_60 == 0,(ly_bool)local_48,
                                      (uint8_t)local_40,local_50,(char **)0x0);
            if (LVar7 == LY_SUCCESS) {
              (plVar11 + lVar10 * 2)[-1] = plVar11[lVar10 * 2];
              goto LAB_00144a2a;
            }
            goto LAB_00144e57;
          }
          if (part == (lysc_range_part *)0x0) {
            lVar10 = -1;
          }
          else {
            lVar10 = part[-1].field_1.max_64 + -1;
          }
          prev = part[lVar10].field_0.min_64;
          value = (char **)0x0;
          plVar12 = local_50;
        }
        else {
          if (!bVar5) {
            if (part == (lysc_range_part *)0x0) {
              plVar11 = (long *)malloc(0x18);
              if (plVar11 == (long *)0x0) goto LAB_00144be7;
              *plVar11 = 1;
              lVar10 = 1;
            }
            else {
              lVar10 = part[-1].field_1.max_64 + 1;
              part[-1].field_1.max_64 = lVar10;
              plVar11 = (long *)realloc(&part[-1].field_1,lVar10 * 0x10 | 8);
              if (plVar11 == (long *)0x0) {
LAB_00144c6c:
                part[-1].field_1.max_64 = part[-1].field_1.max_64 + -1;
                LVar7 = LY_EMEM;
                ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "lys_compile_type_range");
                goto LAB_00144e57;
              }
              lVar10 = *plVar11;
            }
            part = (lysc_range_part *)(plVar11 + 1);
            plVar11[lVar10 * 2 + -1] = 0;
            (plVar11 + lVar10 * 2 + -1)[1] = 0;
            if (local_60 == 0) {
              iVar14 = 0;
            }
            else {
              iVar14 = part[*plVar11 + -2].field_1.max_64;
            }
            LVar7 = range_part_minmax(ctx,(lysc_range_part *)(plVar11 + lVar10 * 2 + -1),'\0',iVar14
                                      ,basetype,local_60 == 0,(ly_bool)local_48,(uint8_t)local_40,
                                      (lysc_range *)0x0,&local_58);
            if (LVar7 != LY_SUCCESS) goto LAB_00144e57;
            plVar11[lVar10 * 2] = (plVar11 + lVar10 * 2)[-1];
LAB_00144a2a:
            bVar5 = false;
            pcVar19 = local_58;
            goto LAB_0014473d;
          }
          if (part == (lysc_range_part *)0x0) {
            lVar10 = -1;
          }
          else {
            lVar10 = part[-1].field_1.max_64 + -1;
          }
          prev = part[lVar10].field_0.min_64;
          value = &local_58;
          plVar12 = (lysc_range *)0x0;
        }
        bVar5 = false;
        LVar7 = range_part_minmax(ctx,part + lVar10,'\x01',prev,basetype,'\0',(ly_bool)local_48,
                                  (uint8_t)local_40,plVar12,value);
        pcVar19 = local_58;
        if (LVar7 != LY_SUCCESS) goto LAB_00144e57;
        goto LAB_0014473d;
      }
      if ((part == (lysc_range_part *)0x0) || (bVar5)) {
        plVar18 = ctx->ctx;
        pcVar20 = "length";
        if (length_restr == '\0') {
          pcVar20 = "range";
        }
        pcVar16 = "Invalid %s restriction - unexpected beginning of the expression (%s).";
        goto LAB_00144e45;
      }
      local_58 = pcVar19 + 1;
      local_60 = local_60 + 1;
      bVar5 = false;
      pcVar19 = local_58;
      goto LAB_0014473d;
    }
    if (pcVar19[1] != '.') goto LAB_0014487d;
    pcVar19 = pcVar19 + 2;
    do {
      local_58 = pcVar19;
      pcVar19 = local_58 + 1;
    } while ((*(byte *)((long)*ppuVar8 + (long)*local_58 * 2 + 1) & 0x20) != 0);
    if ((part == (lysc_range_part *)0x0) ||
       (bVar5 = true, pcVar19 = local_58, part[-1].field_1.max_64 == local_60)) break;
  } while( true );
  pcVar19 = "length";
  if (length_restr == '\0') {
    pcVar19 = "range";
  }
  ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
          "Invalid %s restriction - unexpected \"..\" without a lower bound.",pcVar19);
  goto LAB_00144e4c;
LAB_00144d47:
  do {
    if (plVar2 == (lysc_range_part *)0x0) {
      uVar21 = 0;
    }
    else {
      uVar21 = plVar2[-1].field_1.max_u64;
    }
    if (uVar21 <= uVar17) break;
    uVar21 = part[uVar15].field_0.min_u64;
    uVar3 = plVar2[uVar17].field_0.min_u64;
    if ((uVar13 & 1) == 0) {
      if (uVar21 < uVar3) goto LAB_00144fa7;
    }
    else if ((long)uVar21 < (long)uVar3) goto LAB_00144fa7;
    uVar4 = plVar2[uVar17].field_1.max_u64;
    if (uVar3 == uVar4) {
      if (uVar3 == uVar21) {
        if (uVar21 != part[uVar15].field_1.max_64) goto LAB_00144fa7;
LAB_00144e03:
        uVar17 = uVar17 + 1;
      }
      else {
LAB_00144dcd:
        uVar17 = uVar17 + 1;
        uVar15 = uVar15 - 1;
      }
    }
    else {
      uVar3 = part[uVar15].field_1.max_u64;
      if (uVar21 != uVar3) {
        if ((uVar4 < uVar3 & ((byte)uVar13 ^ 1)) == 0) {
          if (((long)uVar4 < (long)uVar3 & (byte)uVar13) == 0) goto LAB_00144e06;
          if ((long)uVar21 <= (long)uVar4) goto LAB_00144fa7;
        }
        else if (uVar21 <= uVar4) goto LAB_00144fa7;
        uVar15 = uVar15 - 1;
        goto LAB_00144e03;
      }
      bVar5 = uVar4 < uVar21;
      if ((uVar13 & 1) != 0) {
        bVar5 = (long)uVar4 < (long)uVar21;
      }
      if (bVar5) goto LAB_00144dcd;
    }
LAB_00144e06:
    uVar15 = uVar15 + 1;
  } while (uVar15 < local_60 + 1U);
LAB_00144ea5:
  if (uVar15 == local_60 + 1U) {
LAB_00144eae:
    plVar12 = *range;
    if (plVar12 == (lysc_range *)0x0) {
      plVar12 = (lysc_range *)calloc(1,0x30);
      *range = plVar12;
      if (plVar12 == (lysc_range *)0x0) {
        plVar18 = ctx->ctx;
LAB_00144beb:
        ly_log(plVar18,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_range")
        ;
        return LY_EMEM;
      }
    }
    if (plVar6->eapptag != (char *)0x0) {
      lydict_remove(ctx->ctx,plVar12->eapptag);
      LVar7 = lydict_insert(ctx->ctx,plVar6->eapptag,0,&(*range)->eapptag);
      if (LVar7 != LY_SUCCESS) goto LAB_00144e52;
      plVar12 = *range;
    }
    if (plVar6->emsg != (char *)0x0) {
      lydict_remove(ctx->ctx,plVar12->emsg);
      LVar7 = lydict_insert(ctx->ctx,plVar6->emsg,0,&(*range)->emsg);
      if (LVar7 != LY_SUCCESS) goto LAB_00144e52;
      plVar12 = *range;
    }
    if (plVar6->dsc != (char *)0x0) {
      lydict_remove(ctx->ctx,plVar12->dsc);
      LVar7 = lydict_insert(ctx->ctx,plVar6->dsc,0,&(*range)->dsc);
      if (LVar7 != LY_SUCCESS) goto LAB_00144e52;
      plVar12 = *range;
    }
    if (plVar6->ref == (char *)0x0) {
LAB_00144fdd:
      plVar12->parts = part;
      return LY_SUCCESS;
    }
    lydict_remove(ctx->ctx,plVar12->ref);
    LVar7 = lydict_insert(ctx->ctx,plVar6->ref,0,&(*range)->ref);
    if (LVar7 == LY_SUCCESS) {
      plVar12 = *range;
      goto LAB_00144fdd;
    }
    goto LAB_00144e52;
  }
LAB_00144fa7:
  plVar18 = ctx->ctx;
  pcVar20 = "length";
  if (length_restr == '\0') {
    pcVar20 = "range";
  }
  pcVar19 = (local_38->arg).str;
  pcVar16 = "Invalid %s restriction - the derived restriction (%s) is not equally or more limiting."
  ;
LAB_00144e45:
  ly_vlog(plVar18,(char *)0x0,LYVE_SYNTAX_YANG,pcVar16,pcVar20,pcVar19);
LAB_00144e4c:
  LVar7 = LY_EVALID;
LAB_00144e52:
  if (part != (lysc_range_part *)0x0) {
LAB_00144e57:
    free(&part[-1].field_1);
  }
  return LVar7;
}

Assistant:

LY_ERR
lys_compile_type_range(struct lysc_ctx *ctx, const struct lysp_restr *range_p, LY_DATA_TYPE basetype, ly_bool length_restr,
        uint8_t frdigits, struct lysc_range *base_range, struct lysc_range **range)
{
    LY_ERR ret = LY_SUCCESS;
    const char *expr;
    struct lysc_range_part *parts = NULL, *part;
    ly_bool range_expected = 0, uns;
    LY_ARRAY_COUNT_TYPE parts_done = 0, u, v;

    assert(range);
    assert(range_p);

    expr = range_p->arg.str;
    while (1) {
        if (isspace(*expr)) {
            ++expr;
        } else if (*expr == '\0') {
            if (range_expected) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected end of the expression after \"..\" (%s).",
                        length_restr ? "length" : "range", range_p->arg.str);
                ret = LY_EVALID;
                goto cleanup;
            } else if (!parts || (parts_done == LY_ARRAY_COUNT(parts))) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected end of the expression (%s).",
                        length_restr ? "length" : "range", range_p->arg.str);
                ret = LY_EVALID;
                goto cleanup;
            }
            parts_done++;
            break;
        } else if (!strncmp(expr, "min", ly_strlen_const("min"))) {
            if (parts) {
                /* min cannot be used elsewhere than in the first part */
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected data before min keyword (%.*s).", length_restr ? "length" : "range",
                        (int)(expr - range_p->arg.str), range_p->arg.str);
                ret = LY_EVALID;
                goto cleanup;
            }
            expr += ly_strlen_const("min");

            LY_ARRAY_NEW_GOTO(ctx->ctx, parts, part, ret, cleanup);
            LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 0, 0, basetype, 1, length_restr, frdigits, base_range, NULL), cleanup);
            part->max_64 = part->min_64;
        } else if (*expr == '|') {
            if (!parts || range_expected) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected beginning of the expression (%s).", length_restr ? "length" : "range", expr);
                ret = LY_EVALID;
                goto cleanup;
            }
            expr++;
            parts_done++;
            /* process next part of the expression */
        } else if (!strncmp(expr, "..", 2)) {
            expr += 2;
            while (isspace(*expr)) {
                expr++;
            }
            if (!parts || (LY_ARRAY_COUNT(parts) == parts_done)) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected \"..\" without a lower bound.", length_restr ? "length" : "range");
                ret = LY_EVALID;
                goto cleanup;
            }
            /* continue expecting the upper boundary */
            range_expected = 1;
        } else if (isdigit(*expr) || (*expr == '-') || (*expr == '+')) {
            /* number */
            if (range_expected) {
                part = &parts[LY_ARRAY_COUNT(parts) - 1];
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 1, part->min_64, basetype, 0, length_restr, frdigits, NULL, &expr), cleanup);
                range_expected = 0;
            } else {
                LY_ARRAY_NEW_GOTO(ctx->ctx, parts, part, ret, cleanup);
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 0, parts_done ? parts[LY_ARRAY_COUNT(parts) - 2].max_64 : 0,
                        basetype, parts_done ? 0 : 1, length_restr, frdigits, NULL, &expr), cleanup);
                part->max_64 = part->min_64;
            }

            /* continue with possible another expression part */
        } else if (!strncmp(expr, "max", ly_strlen_const("max"))) {
            expr += ly_strlen_const("max");
            while (isspace(*expr)) {
                expr++;
            }
            if (*expr != '\0') {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "Invalid %s restriction - unexpected data after max keyword (%s).",
                        length_restr ? "length" : "range", expr);
                ret = LY_EVALID;
                goto cleanup;
            }
            if (range_expected) {
                part = &parts[LY_ARRAY_COUNT(parts) - 1];
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 1, part->min_64, basetype, 0, length_restr, frdigits, base_range, NULL), cleanup);
                range_expected = 0;
            } else {
                LY_ARRAY_NEW_GOTO(ctx->ctx, parts, part, ret, cleanup);
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 1, parts_done ? parts[LY_ARRAY_COUNT(parts) - 2].max_64 : 0,
                        basetype, parts_done ? 0 : 1, length_restr, frdigits, base_range, NULL), cleanup);
                part->min_64 = part->max_64;
            }
        } else {
            LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "Invalid %s restriction - unexpected data (%s).",
                    length_restr ? "length" : "range", expr);
            ret = LY_EVALID;
            goto cleanup;
        }
    }

    /* check with the previous range/length restriction */
    if (base_range) {
        switch (basetype) {
        case LY_TYPE_BINARY:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
        case LY_TYPE_STRING:
            uns = 1;
            break;
        case LY_TYPE_DEC64:
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
            uns = 0;
            break;
        default:
            LOGINT(ctx->ctx);
            ret = LY_EINT;
            goto cleanup;
        }
        for (u = v = 0; u < parts_done && v < LY_ARRAY_COUNT(base_range->parts); ++u) {
            if ((uns && (parts[u].min_u64 < base_range->parts[v].min_u64)) || (!uns && (parts[u].min_64 < base_range->parts[v].min_64))) {
                goto baseerror;
            }
            /* current lower bound is not lower than the base */
            if (base_range->parts[v].min_64 == base_range->parts[v].max_64) {
                /* base has single value */
                if (base_range->parts[v].min_64 == parts[u].min_64) {
                    /* both lower bounds are the same */
                    if (parts[u].min_64 != parts[u].max_64) {
                        /* current continues with a range */
                        goto baseerror;
                    } else {
                        /* equal single values, move both forward */
                        ++v;
                        continue;
                    }
                } else {
                    /* base is single value lower than current range, so the
                     * value from base range is removed in the current,
                     * move only base and repeat checking */
                    ++v;
                    --u;
                    continue;
                }
            } else {
                /* base is the range */
                if (parts[u].min_64 == parts[u].max_64) {
                    /* current is a single value */
                    if ((uns && (parts[u].max_u64 > base_range->parts[v].max_u64)) || (!uns && (parts[u].max_64 > base_range->parts[v].max_64))) {
                        /* current is behind the base range, so base range is omitted,
                         * move the base and keep the current for further check */
                        ++v;
                        --u;
                    } /* else it is within the base range, so move the current, but keep the base */
                    continue;
                } else {
                    /* both are ranges - check the higher bound, the lower was already checked */
                    if ((uns && (parts[u].max_u64 > base_range->parts[v].max_u64)) || (!uns && (parts[u].max_64 > base_range->parts[v].max_64))) {
                        /* higher bound is higher than the current higher bound */
                        if ((uns && (parts[u].min_u64 > base_range->parts[v].max_u64)) || (!uns && (parts[u].min_64 > base_range->parts[v].max_64))) {
                            /* but the current lower bound is also higher, so the base range is omitted,
                             * continue with the same current, but move the base */
                            --u;
                            ++v;
                            continue;
                        }
                        /* current range starts within the base range but end behind it */
                        goto baseerror;
                    } else {
                        /* current range is smaller than the base,
                         * move current, but stay with the base */
                        continue;
                    }
                }
            }
        }
        if (u != parts_done) {
baseerror:
            LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                    "Invalid %s restriction - the derived restriction (%s) is not equally or more limiting.",
                    length_restr ? "length" : "range", range_p->arg.str);
            ret = LY_EVALID;
            goto cleanup;
        }
    }

    if (!(*range)) {
        *range = calloc(1, sizeof **range);
        LY_CHECK_ERR_RET(!(*range), LOGMEM(ctx->ctx), LY_EMEM);
    }

    /* we rewrite the following values as the types chain is being processed */
    if (range_p->eapptag) {
        lydict_remove(ctx->ctx, (*range)->eapptag);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->eapptag, 0, &(*range)->eapptag), cleanup);
    }
    if (range_p->emsg) {
        lydict_remove(ctx->ctx, (*range)->emsg);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->emsg, 0, &(*range)->emsg), cleanup);
    }
    if (range_p->dsc) {
        lydict_remove(ctx->ctx, (*range)->dsc);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->dsc, 0, &(*range)->dsc), cleanup);
    }
    if (range_p->ref) {
        lydict_remove(ctx->ctx, (*range)->ref);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->ref, 0, &(*range)->ref), cleanup);
    }
    /* extensions are taken only from the last range by the caller */

    (*range)->parts = parts;
    parts = NULL;
cleanup:
    LY_ARRAY_FREE(parts);

    return ret;
}